

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterDropColumn(Parse *pParse,SrcList *pSrc,Token *pName)

{
  char cVar1;
  ushort uVar2;
  sqlite3 *db;
  Schema *pSVar3;
  Column *pCVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Table *pTab;
  Token *zCol;
  Vdbe *p;
  short sVar8;
  uint uVar9;
  Schema **ppSVar10;
  Index *pIVar11;
  Op *pOVar12;
  short sVar13;
  int p2;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  int iVar17;
  uint p2_00;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int p3;
  int regOut;
  
  db = pParse->db;
  if (db->mallocFailed == '\0') {
    zCol = (Token *)0x0;
    pTab = sqlite3LocateTableItem(pParse,0,pSrc->a);
    if (pTab == (Table *)0x0) goto LAB_0017690e;
    iVar5 = isAlterableTable(pParse,pTab);
    if (((iVar5 == 0) && (iVar5 = isRealTable(pParse,pTab,1), iVar5 == 0)) &&
       (zCol = (Token *)sqlite3NameFromToken(db,pName), zCol != (Token *)0x0)) {
      uVar6 = sqlite3ColumnIndex(pTab,(char *)zCol);
      if ((int)uVar6 < 0) {
        pcVar15 = "no such column: \"%T\"";
      }
      else {
        uVar14 = (ulong)uVar6;
        uVar2 = pTab->aCol[uVar14].colFlags;
        if ((uVar2 & 9) != 0) {
          pcVar15 = "PRIMARY KEY";
          if ((uVar2 & 1) == 0) {
            pcVar15 = "UNIQUE";
          }
          sqlite3ErrorMsg(pParse,"cannot drop %s column: \"%s\"",pcVar15,zCol);
          goto LAB_0017690e;
        }
        if (1 < pTab->nCol) {
          if (pTab->pSchema == (Schema *)0x0) {
            uVar18 = 0xffff8000;
          }
          else {
            uVar18 = 0xffffffff;
            ppSVar10 = &db->aDb->pSchema;
            do {
              uVar18 = (ulong)((int)uVar18 + 1);
              pSVar3 = *ppSVar10;
              ppSVar10 = ppSVar10 + 4;
            } while (pSVar3 != pTab->pSchema);
          }
          iVar17 = (int)uVar18;
          pcVar15 = db->aDb[iVar17].zDbSName;
          iVar5 = sqlite3AuthCheck(pParse,0x1a,pcVar15,pTab->zName,(char *)zCol);
          if (iVar5 == 0) {
            uVar9 = (uint)(iVar17 == 1);
            renameTestSchema(pParse,pcVar15,uVar9,"",0);
            renameFixQuotes(pParse,pcVar15,uVar9);
            sqlite3NestedParse(pParse,
                               "UPDATE \"%w\".sqlite_master SET sql = sqlite_drop_column(%d, sql, %d) WHERE (type==\'table\' AND tbl_name=%Q COLLATE nocase)"
                               ,pcVar15,uVar18,(ulong)uVar6,pTab->zName);
            renameReloadSchema(pParse,iVar17,2);
            renameTestSchema(pParse,pcVar15,uVar9,"after drop column",1);
            if ((pParse->nErr == 0) && ((pTab->aCol[uVar14].colFlags & 0x20) == 0)) {
              p = sqlite3GetVdbe(pParse);
              iVar5 = pParse->nTab;
              pParse->nTab = iVar5 + 1;
              sqlite3OpenTable(pParse,iVar5,iVar17,pTab,0x71);
              iVar7 = sqlite3VdbeAddOp3(p,0x24,iVar5,0,0);
              iVar17 = pParse->nMem;
              p2 = iVar17 + 1;
              pParse->nMem = p2;
              if ((pTab->tabFlags & 0x80) == 0) {
                sqlite3VdbeAddOp3(p,0x87,iVar5,p2,0);
                pParse->nMem = pParse->nMem + (int)pTab->nCol;
                pIVar11 = (Index *)0x0;
                uVar9 = 0;
              }
              else {
                for (pIVar11 = pTab->pIndex;
                    (pIVar11 != (Index *)0x0 && ((*(ushort *)&pIVar11->field_0x63 & 3) != 2));
                    pIVar11 = pIVar11->pNext) {
                }
                pParse->nMem = (uint)pIVar11->nColumn + p2;
                uVar9 = (uint)pIVar11->nKeyCol;
                if (pIVar11->nKeyCol != 0) {
                  p2_00 = 0;
                  do {
                    sqlite3VdbeAddOp3(p,0x5e,iVar5,p2_00,iVar17 + 2 + p2_00);
                    p2_00 = p2_00 + 1;
                    uVar9 = (uint)pIVar11->nKeyCol;
                  } while (p2_00 < pIVar11->nKeyCol);
                }
              }
              p3 = pParse->nMem + 1;
              pParse->nMem = p3;
              if (0 < pTab->nCol) {
                uVar18 = 0;
                do {
                  if (uVar18 != uVar14) {
                    pCVar4 = pTab->aCol;
                    if ((pCVar4[uVar18].colFlags & 0x20) == 0) {
                      if (pIVar11 == (Index *)0x0) {
                        regOut = iVar17 + 2 + uVar9;
                      }
                      else {
                        uVar19 = (ulong)pIVar11->nColumn;
                        sVar8 = -1;
                        uVar16 = 0xffff;
                        if (uVar19 != 0) {
                          uVar16 = 0;
                          do {
                            if (pIVar11->aiColumn[uVar16] == (short)uVar18) goto LAB_00176cc8;
                            uVar16 = uVar16 + 1;
                          } while (uVar19 != uVar16);
                          uVar16 = 0xffff;
                        }
LAB_00176cc8:
                        if (uVar19 != 0) {
                          uVar20 = 0;
                          do {
                            if (pIVar11->aiColumn[uVar20] == (short)uVar6) {
                              sVar8 = (short)uVar20;
                              break;
                            }
                            uVar20 = uVar20 + 1;
                          } while (uVar19 != uVar20);
                        }
                        sVar13 = (short)uVar16;
                        regOut = (iVar17 + 2 + (int)sVar13) - (uint)(sVar8 < sVar13);
                        if ((int)sVar13 < (int)(uint)pIVar11->nKeyCol) goto LAB_00176da3;
                      }
                      if (uVar18 == (uint)(int)pTab->iPKey) {
                        sqlite3VdbeAddOp3(p,0x4b,0,regOut,0);
                      }
                      else {
                        cVar1 = pCVar4[uVar18].affinity;
                        if (cVar1 == 'E') {
                          pCVar4[uVar18].affinity = 'C';
                        }
                        sqlite3ExprCodeGetColumnOfTable(p,pTab,iVar5,(int)uVar18,regOut);
                        pTab->aCol[uVar18].affinity = cVar1;
                      }
                      uVar9 = uVar9 + 1;
                    }
                  }
LAB_00176da3:
                  uVar18 = uVar18 + 1;
                } while ((long)uVar18 < (long)pTab->nCol);
              }
              if (uVar9 == 0) {
                pParse->nMem = pParse->nMem + 1;
                sqlite3VdbeAddOp3(p,0x4b,0,iVar17 + 2,0);
                uVar9 = 1;
              }
              sqlite3VdbeAddOp3(p,0x61,iVar17 + 2,uVar9,p3);
              if (pIVar11 == (Index *)0x0) {
                sqlite3VdbeAddOp3(p,0x80,iVar5,p3,p2);
              }
              else {
                sqlite3VdbeAddOp4Int(p,0x8a,iVar5,p3,iVar17 + 2,(uint)pIVar11->nKeyCol);
              }
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = 2;
              }
              sqlite3VdbeAddOp3(p,0x27,iVar5,iVar7 + 1,0);
              if (p->db->mallocFailed == '\0') {
                pOVar12 = p->aOp + iVar7;
              }
              else {
                pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar12->p2 = p->nOp;
            }
          }
          goto LAB_0017690e;
        }
        pcVar15 = "cannot drop column \"%s\": no other columns exist";
        pName = zCol;
      }
      sqlite3ErrorMsg(pParse,pcVar15,pName);
      goto LAB_0017690e;
    }
  }
  zCol = (Token *)0x0;
LAB_0017690e:
  if (zCol != (Token *)0x0) {
    sqlite3DbFreeNN(db,zCol);
  }
  sqlite3SrcListDelete(db,pSrc);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterDropColumn(Parse *pParse, SrcList *pSrc, const Token *pName){
  sqlite3 *db = pParse->db;       /* Database handle */
  Table *pTab;                    /* Table to modify */
  int iDb;                        /* Index of db containing pTab in aDb[] */
  const char *zDb;                /* Database containing pTab ("main" etc.) */
  char *zCol = 0;                 /* Name of column to drop */
  int iCol;                       /* Index of column zCol in pTab->aCol[] */

  /* Look up the table being altered. */
  assert( pParse->pNewTable==0 );
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  if( NEVER(db->mallocFailed) ) goto exit_drop_column;
  pTab = sqlite3LocateTableItem(pParse, 0, &pSrc->a[0]);
  if( !pTab ) goto exit_drop_column;

  /* Make sure this is not an attempt to ALTER a view, virtual table or
  ** system table. */
  if( SQLITE_OK!=isAlterableTable(pParse, pTab) ) goto exit_drop_column;
  if( SQLITE_OK!=isRealTable(pParse, pTab, 1) ) goto exit_drop_column;

  /* Find the index of the column being dropped. */
  zCol = sqlite3NameFromToken(db, pName);
  if( zCol==0 ){
    assert( db->mallocFailed );
    goto exit_drop_column;
  }
  iCol = sqlite3ColumnIndex(pTab, zCol);
  if( iCol<0 ){
    sqlite3ErrorMsg(pParse, "no such column: \"%T\"", pName);
    goto exit_drop_column;
  }

  /* Do not allow the user to drop a PRIMARY KEY column or a column
  ** constrained by a UNIQUE constraint.  */
  if( pTab->aCol[iCol].colFlags & (COLFLAG_PRIMKEY|COLFLAG_UNIQUE) ){
    sqlite3ErrorMsg(pParse, "cannot drop %s column: \"%s\"",
        (pTab->aCol[iCol].colFlags&COLFLAG_PRIMKEY) ? "PRIMARY KEY" : "UNIQUE",
        zCol
    );
    goto exit_drop_column;
  }

  /* Do not allow the number of columns to go to zero */
  if( pTab->nCol<=1 ){
    sqlite3ErrorMsg(pParse, "cannot drop column \"%s\": no other columns exist",zCol);
    goto exit_drop_column;
  }

  /* Edit the sqlite_schema table */
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 );
  zDb = db->aDb[iDb].zDbSName;
#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, zCol) ){
    goto exit_drop_column;
  }
#endif
  renameTestSchema(pParse, zDb, iDb==1, "", 0);
  renameFixQuotes(pParse, zDb, iDb==1);
  sqlite3NestedParse(pParse,
      "UPDATE \"%w\"." LEGACY_SCHEMA_TABLE " SET "
      "sql = sqlite_drop_column(%d, sql, %d) "
      "WHERE (type=='table' AND tbl_name=%Q COLLATE nocase)"
      , zDb, iDb, iCol, pTab->zName
  );

  /* Drop and reload the database schema. */
  renameReloadSchema(pParse, iDb, INITFLAG_AlterDrop);
  renameTestSchema(pParse, zDb, iDb==1, "after drop column", 1);

  /* Edit rows of table on disk */
  if( pParse->nErr==0 && (pTab->aCol[iCol].colFlags & COLFLAG_VIRTUAL)==0 ){
    int i;
    int addr;
    int reg;
    int regRec;
    Index *pPk = 0;
    int nField = 0;               /* Number of non-virtual columns after drop */
    int iCur;
    Vdbe *v = sqlite3GetVdbe(pParse);
    iCur = pParse->nTab++;
    sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenWrite);
    addr = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    reg = ++pParse->nMem;
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, reg);
      pParse->nMem += pTab->nCol;
    }else{
      pPk = sqlite3PrimaryKeyIndex(pTab);
      pParse->nMem += pPk->nColumn;
      for(i=0; i<pPk->nKeyCol; i++){
        sqlite3VdbeAddOp3(v, OP_Column, iCur, i, reg+i+1);
      }
      nField = pPk->nKeyCol;
    }
    regRec = ++pParse->nMem;
    for(i=0; i<pTab->nCol; i++){
      if( i!=iCol && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ){
        int regOut;
        if( pPk ){
          int iPos = sqlite3TableColumnToIndex(pPk, i);
          int iColPos = sqlite3TableColumnToIndex(pPk, iCol);
          if( iPos<pPk->nKeyCol ) continue;
          regOut = reg+1+iPos-(iPos>iColPos);
        }else{
          regOut = reg+1+nField;
        }
        if( i==pTab->iPKey ){
          sqlite3VdbeAddOp2(v, OP_Null, 0, regOut);
        }else{
          char aff = pTab->aCol[i].affinity;
          if( aff==SQLITE_AFF_REAL ){
            pTab->aCol[i].affinity = SQLITE_AFF_NUMERIC;
          }
          sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, i, regOut);
          pTab->aCol[i].affinity = aff;
        }
        nField++;
      }
    }
    if( nField==0 ){
      /* dbsqlfuzz 5f09e7bcc78b4954d06bf9f2400d7715f48d1fef */
      pParse->nMem++;
      sqlite3VdbeAddOp2(v, OP_Null, 0, reg+1);
      nField = 1;
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, reg+1, nField, regRec);
    if( pPk ){
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iCur, regRec, reg+1, pPk->nKeyCol);
    }else{
      sqlite3VdbeAddOp3(v, OP_Insert, iCur, regRec, reg);
    }
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);

    sqlite3VdbeAddOp2(v, OP_Next, iCur, addr+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr);
  }

exit_drop_column:
  sqlite3DbFree(db, zCol);
  sqlite3SrcListDelete(db, pSrc);
}